

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abeta.hpp
# Opt level: O2

vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> * __thiscall
minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>::operator()
          (vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>
           *__return_storage_ptr__,ABeta<ttt::Board,_minimax::Eval<ttt::Board>_> *this,Board *game,
          int depth)

{
  __normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
  __last;
  pointer pfVar1;
  int iVar2;
  int iVar3;
  pointer this_00;
  bool bVar4;
  vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> r;
  vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
  futures;
  future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_> local_80;
  vector<long,_std::allocator<long>_> moves;
  mutex mutex;
  
  if (depth < 1) {
    (__return_storage_ptr__->
    super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    ttt::Board::GetPossibleMoves(&moves,game);
    futures.
    super__Vector_base<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    futures.
    super__Vector_base<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    futures.
    super__Vector_base<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar2 = std::thread::hardware_concurrency();
    iVar3 = 0;
    if (0 < iVar2) {
      iVar3 = iVar2;
    }
    while (pfVar1 = futures.
                    super__Vector_base<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish, bVar4 = iVar3 != 0,
          iVar3 = iVar3 + -1, bVar4) {
      r.super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_2_ =
           *(undefined2 *)((game->board)._M_elems[2]._M_elems + 2);
      r.super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = *(pointer *)(game->board)._M_elems;
      r.super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&moves;
      r.super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = depth;
      std::operator()((launch)&local_80,(anon_class_32_4_8e83780c_for__M_head_impl *)0x1);
      std::
      vector<std::future<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>,std::allocator<std::future<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>>>
      ::
      emplace_back<std::future<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>>
                ((vector<std::future<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>,std::allocator<std::future<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>>>
                  *)&futures,&local_80);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_80.
                  super___basic_future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
                  ._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    (__return_storage_ptr__->
    super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (this_00 = futures.
                   super__Vector_base<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != pfVar1;
        this_00 = this_00 + 1) {
      std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
      ::get(&r,this_00);
      __last._M_current._2_2_ =
           r.super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish._2_2_;
      __last._M_current._0_2_ =
           r.super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish._0_2_;
      __last._M_current._4_4_ =
           r.super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish._4_4_;
      std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>::
      insert<__gnu_cxx::__normal_iterator<std::pair<long,double>*,std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>,void>
                ((vector<std::pair<long,double>,std::allocator<std::pair<long,double>>> *)
                 __return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
                  )r.
                   super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,__last);
      std::_Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>::
      ~_Vector_base(&r.
                     super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>
                   );
    }
    std::operator()((__return_storage_ptr__->
                    super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>
                    )._M_impl.super__Vector_impl_data._M_start,
                    (__return_storage_ptr__->
                    super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
    ::~vector(&futures);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&moves.super__Vector_base<long,_std::allocator<long>_>);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<game::IMove, double>>
ABeta<IGame, Eval>::operator()(const IGame &game, int depth) const
{
    if (depth <= 0)
        return {};

    auto moves = game.GetPossibleMoves();
    std::vector<std::future<std::vector<std::pair<game::IMove, double>>>> futures;
    int num_threads = std::thread::hardware_concurrency();
    std::mutex mutex;

    for (int i = 0; i < num_threads; ++i)
        futures.emplace_back(std::async(std::launch::async, [game, depth, &moves, &mutex] {
            std::vector<std::pair<game::IMove, double>> results;
            while (true)
            {
                mutex.lock();
                if (moves.empty())
                {
                    mutex.unlock();
                    break;
                }
                game::IMove move = moves.back();
                moves.pop_back();
                mutex.unlock();
                IGame new_game(game);
                new_game.ApplyMove(move);
                results.emplace_back(move, -ABeta_<IGame, Eval>(new_game, depth - 1, -std::numeric_limits<double>::max(), std::numeric_limits<double>::max()));
            }
            return results;
        }));

    std::vector<std::pair<game::IMove, double>> results;
    for (auto &f : futures)
    {
        auto r = f.get();
        results.insert(std::end(results), std::begin(r), std::end(r));
    }

    std::sort(std::begin(results), std::end(results), [](const std::pair<game::IMove, double> &e1, const std::pair<game::IMove, double> &e2) {
        return e1.second > e2.second;
    });
    return results;
}